

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerCPP::emit_push_constant_block(CompilerCPP *this,SPIRVariable *var)

{
  ID *__k;
  uint32_t uVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  SPIRType *type;
  CompilerError *this_00;
  char (*ts_3) [3];
  string instance_name;
  string buffer_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __k = &(var->super_IVariant).self;
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  if (((pmVar3->decoration).decoration_flags.lower & 0x600000000) == 0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (pSVar2->super_IVariant).self.id)
    ;
    (type->type_alias).id = 0;
    CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_40,this,(ulong)(pSVar2->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_60,this,(ulong)__k->id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
              (&local_80,this,pSVar2,(ulong)__k->id);
    CompilerGLSL::
    statement<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [24])"internal::PushConstant<",&local_40,
               &local_80,(char (*) [3])0x313c07,&local_60,(char (*) [2])0x313c50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    uVar1 = (this->super_CompilerGLSL).indent;
    (this->super_CompilerGLSL).indent = 0;
    ts_3 = (char (*) [3])0x309231;
    CompilerGLSL::
    statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[7]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",&local_60,(char (*) [9])" __res->"
               ,&local_60,(char (*) [7])0x309231);
    (this->super_CompilerGLSL).indent = uVar1;
    join<char_const(&)[26],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
              (&local_80,(spirv_cross *)"s.register_push_constant(",(char (*) [26])&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2fbcf2,
               (char (*) [3])0x313c4f,ts_3);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&this->resource_registrations,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2f08f5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,
             "Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. Remap to location with reflection API first or disable these decorations."
            );
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerCPP::emit_push_constant_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = ir.meta[var.self].decoration.decoration_flags;
	if (flags.get(DecorationBinding) || flags.get(DecorationDescriptorSet))
		SPIRV_CROSS_THROW("Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. "
		                  "Remap to location with reflection API first or disable these decorations.");

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);
	auto instance_name = to_name(var.self);

	statement("internal::PushConstant<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, ".get()");
	resource_registrations.push_back(join("s.register_push_constant(", instance_name, "__", ");"));
	statement("");
}